

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2espec.cc
# Opt level: O0

void start_checkpoint(storage_t *st)

{
  fdb_status fVar1;
  checkpoint_t *__s;
  void *in_RDI;
  storage_t *unaff_retaddr;
  fdb_doc *chk_doc;
  fdb_status status;
  checkpoint_t *chk;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  undefined7 in_stack_ffffffffffffff80;
  fdb_isolation_level_t in_stack_ffffffffffffff87;
  fdb_file_handle *in_stack_ffffffffffffff88;
  checkpoint_t *keylen;
  fdb_doc *doc;
  undefined4 in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffb0;
  tx_type_t in_stack_ffffffffffffffee;
  size_t in_stack_fffffffffffffff0;
  
  gettimeofday((timeval *)&stack0xffffffffffffffe8,(__timezone_ptr_t)0x0);
  doc = (fdb_doc *)0x0;
  fVar1 = fdb_begin_transaction(in_stack_ffffffffffffff88,in_stack_ffffffffffffff87);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2espec.cc"
            ,0x13c);
    start_checkpoint::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2espec.cc"
                    ,0x13c,"void start_checkpoint(storage_t *)");
    }
    fVar1 = FDB_RESULT_SUCCESS;
  }
  __s = create_checkpoint((storage_t *)__test_prev.tv_sec,__test_cur.tv_usec._6_2_);
  keylen = __s;
  strlen(__s->key);
  fdb_doc_create((fdb_doc **)CONCAT44(fVar1,in_stack_ffffffffffffff98),doc,(size_t)keylen,
                 (void *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),0x430,
                 (void *)0x10a5c5,in_stack_ffffffffffffffb0);
  save_tx(unaff_retaddr,in_RDI,in_stack_fffffffffffffff0,in_stack_ffffffffffffffee);
  fVar1 = fdb_set(*(fdb_kvs_handle **)((long)in_RDI + 0x30),doc);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2espec.cc"
            ,0x146);
    start_checkpoint::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2espec.cc"
                    ,0x146,"void start_checkpoint(storage_t *)");
    }
  }
  free(__s);
  fdb_doc_free((fdb_doc *)0x10a675);
  return;
}

Assistant:

void start_checkpoint(storage_t *st)
{
    TEST_INIT();

    checkpoint_t *chk;
    fdb_status status;
    fdb_doc *chk_doc = NULL;

    status = fdb_begin_transaction(st->records, FDB_ISOLATION_READ_COMMITTED);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // create opening checkpoint doc
    chk = create_checkpoint(st, START_CHECKPOINT);
    fdb_doc_create(&chk_doc, chk->key, strlen(chk->key),
                   NULL, 0, chk, sizeof(checkpoint_t));

    // save checkpoint transaction
    save_tx(st, chk_doc->key, chk_doc->keylen, START_CHECKPOINT);
    status = fdb_set(st->chk, chk_doc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);


#ifdef __DEBUG_E2E
    char rbuf[256];
    sprintf(rbuf, "start checkpoint[seqno:%" _F64 "]",chk->seqnum_all);
    TEST_RESULT(rbuf);
#endif

    free(chk);
    fdb_doc_free(chk_doc);
    chk_doc=NULL;
    chk=NULL;


}